

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O3

_Bool tcg_out_dup_vec(TCGContext_conflict9 *s,TCGType_conflict type,uint vece,TCGReg r,TCGReg a)

{
  byte *pbVar1;
  char cVar2;
  int opc;
  tcg_insn_unit **pptVar3;
  TCGReg v;
  int in_R9D;
  byte bVar4;
  
  cVar2 = (char)r;
  if (have_avx2_tricore) {
    opc = (uint)(type == TCG_TYPE_V256) * 0x80000 + avx2_dup_insn[vece];
    v = TCG_REG_EAX;
LAB_00d05d9e:
    tcg_out_vex_opc(s,opc,r,v,a,in_R9D);
    bVar4 = ((byte)a & 7) + cVar2 * '\b' | 0xc0;
    goto LAB_00d05eba;
  }
  switch(vece) {
  case 0:
    tcg_out_vex_opc(s,0x560,r,a,a,in_R9D);
    pbVar1 = s->code_ptr;
    s->code_ptr = pbVar1 + 1;
    *pbVar1 = ((byte)a & 7) + cVar2 * '\b' | 0xc0;
    a = r;
    break;
  case 1:
    break;
  case 2:
    goto LAB_00d05e7b;
  case 3:
    opc = 0x56c;
    v = a;
    goto LAB_00d05d9e;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
               ,0x392,(char *)0x0);
  }
  tcg_out_vex_opc(s,0x561,r,a,a,in_R9D);
  pbVar1 = s->code_ptr;
  s->code_ptr = pbVar1 + 1;
  *pbVar1 = (byte)a & 7 | cVar2 * '\b' | 0xc0;
  a = r;
LAB_00d05e7b:
  bVar4 = 0;
  tcg_out_vex_opc(s,0x570,r,0,a,in_R9D);
  pbVar1 = s->code_ptr;
  s->code_ptr = pbVar1 + 1;
  *pbVar1 = (byte)a & 7 | cVar2 * '\b' | 0xc0;
LAB_00d05eba:
  pptVar3 = &s->code_ptr;
  pbVar1 = *pptVar3;
  *pptVar3 = pbVar1 + 1;
  *pbVar1 = bVar4;
  return SUB81(pptVar3,0);
}

Assistant:

static bool tcg_out_dup_vec(TCGContext *s, TCGType type, unsigned vece,
                            TCGReg r, TCGReg a)
{
    if (have_avx2) {
        int vex_l = (type == TCG_TYPE_V256 ? P_VEXL : 0);
        tcg_out_vex_modrm(s, avx2_dup_insn[vece] + vex_l, r, 0, a);
    } else {
        switch (vece) {
        case MO_8:
            /* ??? With zero in a register, use PSHUFB.  */
            tcg_out_vex_modrm(s, OPC_PUNPCKLBW, r, a, a);
            a = r;
            /* FALLTHRU */
        case MO_16:
            tcg_out_vex_modrm(s, OPC_PUNPCKLWD, r, a, a);
            a = r;
            /* FALLTHRU */
        case MO_32:
            tcg_out_vex_modrm(s, OPC_PSHUFD, r, 0, a);
            /* imm8 operand: all output lanes selected from input lane 0.  */
            tcg_out8(s, 0);
            break;
        case MO_64:
            tcg_out_vex_modrm(s, OPC_PUNPCKLQDQ, r, a, a);
            break;
        default:
            g_assert_not_reached();
        }
    }
    return true;
}